

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_construct.cpp
# Opt level: O0

void __thiscall tst_qpromise_construct::connectAndResolve(tst_qpromise_construct *this)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::shared_ptr<int>_>_> *this_00;
  bool bVar1;
  QObject *pQVar2;
  long local_c8;
  long local_c0 [3];
  shared_ptr<int> local_a8;
  shared_ptr<int> local_98;
  QPromise<std::shared_ptr<int>_> local_88;
  QString local_78;
  int local_60;
  bool local_5a;
  bool local_59;
  anon_class_16_2_b7a83811 local_58;
  undefined1 local_48 [8];
  QPromise<std::shared_ptr<int>_> p;
  weak_ptr<int> wptr;
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_> local_18;
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_> object;
  tst_qpromise_construct *this_local;
  
  object.d = &this->super_QObject;
  pQVar2 = (QObject *)operator_new(0x10);
  QObject::QObject(pQVar2,(QObject *)0x0);
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_>::QScopedPointer(&local_18,pQVar2);
  this_00 = &p.super_QPromiseBase<std::shared_ptr<int>_>.m_d;
  std::weak_ptr<int>::weak_ptr((weak_ptr<int> *)this_00);
  local_58.object = &local_18;
  local_58.wptr = (weak_ptr<int> *)this_00;
  QtPromise::QPromise<std::shared_ptr<int>>::
  QPromise<tst_qpromise_construct::connectAndResolve()::__0>
            ((QPromise<std::shared_ptr<int>> *)local_48,&local_58);
  local_59 = QtPromise::QPromiseBase<std::shared_ptr<int>_>::isPending
                       ((QPromiseBase<std::shared_ptr<int>_> *)local_48);
  local_5a = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_59,&local_5a,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                     ,0x12d);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pQVar2 = QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_>::operator->(&local_18);
    QString::QString(&local_78,"foobar");
    QObject::setObjectName((QString *)pQVar2);
    QString::~QString(&local_78);
    std::shared_ptr<int>::shared_ptr(&local_98);
    waitForValue<std::shared_ptr<int>>(&local_88,(shared_ptr<int> *)local_48);
    std::weak_ptr<int>::lock((weak_ptr<int> *)&local_a8);
    bVar1 = QTest::qCompare<std::shared_ptr<int>,std::shared_ptr<int>>
                      ((shared_ptr<int> *)&local_88,&local_a8,
                       "waitForValue(p, std::shared_ptr<int>{})","wptr.lock()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                       ,0x131);
    std::shared_ptr<int>::~shared_ptr(&local_a8);
    std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&local_88);
    std::shared_ptr<int>::~shared_ptr(&local_98);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_c0[2] = std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::use_count
                              ((__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)
                               &p.super_QPromiseBase<std::shared_ptr<int>_>.m_d);
      local_c0[1] = 1;
      bVar1 = QTest::qCompare<long,long>
                        (local_c0 + 2,local_c0 + 1,"wptr.use_count()","1l",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                         ,0x132);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_60 = 0;
      }
      else {
        local_60 = 1;
      }
    }
    else {
      local_60 = 1;
    }
  }
  else {
    local_60 = 1;
  }
  QtPromise::QPromise<std::shared_ptr<int>_>::~QPromise((QPromise<std::shared_ptr<int>_> *)local_48)
  ;
  if (local_60 == 0) {
    local_c0[0] = std::__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>::use_count
                            ((__weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> *)
                             &p.super_QPromiseBase<std::shared_ptr<int>_>.m_d);
    local_c8 = 0;
    bVar1 = QTest::qCompare<long,long>
                      (local_c0,&local_c8,"wptr.use_count()","0l",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_construct.cpp"
                       ,0x135);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_60 = 0;
    }
    else {
      local_60 = 1;
    }
  }
  std::weak_ptr<int>::~weak_ptr((weak_ptr<int> *)&p.super_QPromiseBase<std::shared_ptr<int>_>.m_d);
  QScopedPointer<QObject,_QScopedPointerDeleter<QObject>_>::~QScopedPointer(&local_18);
  return;
}

Assistant:

void tst_qpromise_construct::connectAndResolve()
{
    QScopedPointer<QObject> object(new QObject{});

    std::weak_ptr<int> wptr;

    {
        auto p = QtPromise::QPromise<std::shared_ptr<int>>{
            [&](const QtPromise::QPromiseResolve<std::shared_ptr<int>>& resolve,
                const QtPromise::QPromiseReject<std::shared_ptr<int>>& reject) {
                connect(object.data(),
                        &QObject::objectNameChanged,
                        [=, &wptr](const QString& name) {
                            auto sptr = std::make_shared<int>(42);

                            wptr = sptr;

                            if (name == "foobar") {
                                resolve(sptr);
                            } else {
                                reject(42);
                            }
                        });
            }};

        QCOMPARE(p.isPending(), true);

        object->setObjectName("foobar");

        QCOMPARE(waitForValue(p, std::shared_ptr<int>{}), wptr.lock());
        QCOMPARE(wptr.use_count(), 1l); // "p" still holds a reference
    }

    QCOMPARE(wptr.use_count(), 0l);
}